

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O0

void __thiscall QSslSocketPrivate::_q_bytesWrittenSlot(QSslSocketPrivate *this,qint64 written)

{
  bool bVar1;
  QSslSocket *pQVar2;
  QSslSocketPrivate *in_RDI;
  QSslSocket *q;
  qint64 in_stack_ffffffffffffffd8;
  
  pQVar2 = q_func(in_RDI);
  if (in_RDI->mode == UnencryptedMode) {
    QIODevice::bytesWritten((longlong)pQVar2);
  }
  else {
    QSslSocket::encryptedBytesWritten((QSslSocket *)0x3a6a97,in_stack_ffffffffffffffd8);
  }
  if (((in_RDI->super_QTcpSocketPrivate).super_QAbstractSocketPrivate.state == ClosingState) &&
     (bVar1 = QIODevicePrivate::QRingBufferRef::isEmpty((QRingBufferRef *)in_RDI), bVar1)) {
    (**(code **)(*(long *)&(pQVar2->super_QTcpSocket).super_QAbstractSocket + 0x100))();
  }
  return;
}

Assistant:

void QSslSocketPrivate::_q_bytesWrittenSlot(qint64 written)
{
    Q_Q(QSslSocket);
#ifdef QSSLSOCKET_DEBUG
    qCDebug(lcSsl) << "QSslSocket::_q_bytesWrittenSlot(" << written << ')';
#endif

    if (mode == QSslSocket::UnencryptedMode)
        emit q->bytesWritten(written);
    else
        emit q->encryptedBytesWritten(written);
    if (state == QAbstractSocket::ClosingState && writeBuffer.isEmpty())
        q->disconnectFromHost();
}